

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

NetType * __thiscall slang::ast::Scope::getDefaultNetType(Scope *this)

{
  Symbol *this_00;
  PackageSymbol *pPVar1;
  InstanceBodySymbol *this_01;
  DefinitionSymbol *pDVar2;
  NetType *pNVar3;
  Scope *in_RDI;
  Symbol *sym;
  Scope *current;
  TokenKind in_stack_0000006e;
  Compilation *in_stack_00000070;
  Scope *local_18;
  
  local_18 = in_RDI;
  while( true ) {
    this_00 = asSymbol(local_18);
    if (this_00->kind == Package) {
      pPVar1 = Symbol::as<slang::ast::PackageSymbol>((Symbol *)0x9edd1e);
      return pPVar1->defaultNetType;
    }
    if (this_00->kind == InstanceBody) break;
    local_18 = Symbol::getParentScope(this_00);
    if (local_18 == (Scope *)0x0) {
      getCompilation(in_RDI);
      pNVar3 = Compilation::getNetType(in_stack_00000070,in_stack_0000006e);
      return pNVar3;
    }
  }
  this_01 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x9edd3d);
  pDVar2 = InstanceBodySymbol::getDefinition(this_01);
  return pDVar2->defaultNetType;
}

Assistant:

const NetType& Scope::getDefaultNetType() const {
    const Scope* current = this;
    do {
        auto& sym = current->asSymbol();
        switch (sym.kind) {
            case SymbolKind::Package:
                return sym.as<PackageSymbol>().defaultNetType;
            default:
                if (sym.kind == SymbolKind::InstanceBody)
                    return sym.as<InstanceBodySymbol>().getDefinition().defaultNetType;
                else
                    current = sym.getParentScope();
                break;
        }
    } while (current);

    return getCompilation().getNetType(TokenKind::Unknown);
}